

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cGLSLnoperspectiveTests.cpp
# Opt level: O1

void gl3cts::link_program
               (Context *context,GLuint fragment_shader_id,GLuint vertex_shader_id,
               GLuint program_object_id)

{
  ostringstream *this;
  int iVar1;
  deUint32 dVar2;
  undefined4 extraout_var;
  MessageBuilder *this_00;
  TestError *this_01;
  GLint length;
  GLint status;
  vector<char,_std::allocator<char>_> message;
  int local_1cc;
  vector<char,_std::allocator<char>_> local_1c8;
  pointer local_1b0;
  undefined1 local_1a8 [120];
  ios_base local_130 [264];
  long lVar3;
  
  iVar1 = (*context->m_renderCtx->_vptr_RenderContext[3])();
  lVar3 = CONCAT44(extraout_var,iVar1);
  local_1cc = 0;
  if (fragment_shader_id != 0) {
    (**(code **)(lVar3 + 0x10))(program_object_id,fragment_shader_id);
    dVar2 = (**(code **)(lVar3 + 0x800))();
    glu::checkError(dVar2,"AttachShader",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cGLSLnoperspectiveTests.cpp"
                    ,0x8f);
  }
  if (vertex_shader_id != 0) {
    (**(code **)(lVar3 + 0x10))(program_object_id,vertex_shader_id);
    dVar2 = (**(code **)(lVar3 + 0x800))();
    glu::checkError(dVar2,"AttachShader",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cGLSLnoperspectiveTests.cpp"
                    ,0x95);
  }
  (**(code **)(lVar3 + 0xce8))(program_object_id);
  dVar2 = (**(code **)(lVar3 + 0x800))();
  glu::checkError(dVar2,"LinkProgram",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cGLSLnoperspectiveTests.cpp"
                  ,0x9a);
  (**(code **)(lVar3 + 0x9d8))(program_object_id,0x8b82,&local_1cc);
  dVar2 = (**(code **)(lVar3 + 0x800))();
  glu::checkError(dVar2,"GetProgramiv",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cGLSLnoperspectiveTests.cpp"
                  ,0x9e);
  if (local_1cc == 1) {
    return;
  }
  local_1c8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  local_1c8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_1c8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (**(code **)(lVar3 + 0x9d8))(program_object_id,0x8b84);
  dVar2 = (**(code **)(lVar3 + 0x800))();
  glu::checkError(dVar2,"GetProgramiv",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cGLSLnoperspectiveTests.cpp"
                  ,0xa8);
  std::vector<char,_std::allocator<char>_>::resize(&local_1c8,0);
  (**(code **)(lVar3 + 0x988))
            (program_object_id,0,0,
             local_1c8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start);
  dVar2 = (**(code **)(lVar3 + 0x800))();
  glu::checkError(dVar2,"GetProgramInfoLog",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cGLSLnoperspectiveTests.cpp"
                  ,0xae);
  local_1a8._0_8_ = context->m_testCtx->m_log;
  this = (ostringstream *)(local_1a8 + 8);
  std::__cxx11::ostringstream::ostringstream(this);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this,"Failed to link program:\n",0x18);
  local_1b0 = local_1c8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
              super__Vector_impl_data._M_start;
  this_00 = tcu::MessageBuilder::operator<<((MessageBuilder *)local_1a8,&local_1b0);
  tcu::MessageBuilder::operator<<(this_00,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(this);
  std::ios_base::~ios_base(local_130);
  this_01 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_01,"Failed to link program",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cGLSLnoperspectiveTests.cpp"
             ,0xb4);
  __cxa_throw(this_01,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void link_program(deqp::Context& context, glw::GLuint fragment_shader_id, glw::GLuint vertex_shader_id,
				  glw::GLuint program_object_id)
{
	/* GL entry points */
	const glw::Functions& gl = context.getRenderContext().getFunctions();

	/* Link status */
	glw::GLint status = GL_FALSE;

	/* Attach shaders */
	if (0 != fragment_shader_id)
	{
		gl.attachShader(program_object_id, fragment_shader_id);
		GLU_EXPECT_NO_ERROR(gl.getError(), "AttachShader");
	}

	if (0 != vertex_shader_id)
	{
		gl.attachShader(program_object_id, vertex_shader_id);
		GLU_EXPECT_NO_ERROR(gl.getError(), "AttachShader");
	}

	/* Link */
	gl.linkProgram(program_object_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "LinkProgram");

	/* Get link status */
	gl.getProgramiv(program_object_id, GL_LINK_STATUS, &status);
	GLU_EXPECT_NO_ERROR(gl.getError(), "GetProgramiv");

	/* Log link error */
	if (GL_TRUE != status)
	{
		glw::GLint				 length = 0;
		std::vector<glw::GLchar> message;

		/* Get error log length */
		gl.getProgramiv(program_object_id, GL_INFO_LOG_LENGTH, &length);
		GLU_EXPECT_NO_ERROR(gl.getError(), "GetProgramiv");

		message.resize(length);

		/* Get error log */
		gl.getProgramInfoLog(program_object_id, length, 0, &message[0]);
		GLU_EXPECT_NO_ERROR(gl.getError(), "GetProgramInfoLog");

		/* Log */
		context.getTestContext().getLog() << tcu::TestLog::Message << "Failed to link program:\n"
										  << &message[0] << tcu::TestLog::EndMessage;

		TCU_FAIL("Failed to link program");
	}
}